

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.hpp
# Opt level: O1

void __thiscall
ableton::link::
Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
::Controller(Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
             *this,double *tempo,undefined8 *peerCallback,undefined8 *tempoCallback,
            _Head_base<0UL,_asio::io_context_*,_false> *param_5)

{
  function<void_(unsigned_long)> *pfVar1;
  double dVar2;
  _Manager_type p_Var3;
  undefined8 uVar4;
  rep rVar5;
  long lVar6;
  longlong lVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  timespec ts;
  _Any_data local_118;
  _Manager_type local_108;
  _Invoker_type p_Stack_100;
  function<void_(unsigned_long)> *local_f8;
  ControllerPeers *local_f0;
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> local_e8;
  double local_c8;
  long lStack_c0;
  double local_b8;
  rep rStack_b0;
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> local_a8;
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> local_88;
  pair<ableton::link::NodeState,_ableton::link::GhostXForm> local_68;
  
  *(undefined8 *)&(this->mTempoCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->mTempoCallback).super__Function_base._M_functor + 8) = 0;
  (this->mTempoCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mTempoCallback)._M_invoker = (_Invoker_type)tempoCallback[3];
  if (tempoCallback[2] != 0) {
    uVar4 = tempoCallback[1];
    *(undefined8 *)&(this->mTempoCallback).super__Function_base._M_functor = *tempoCallback;
    *(undefined8 *)((long)&(this->mTempoCallback).super__Function_base._M_functor + 8) = uVar4;
    (this->mTempoCallback).super__Function_base._M_manager = (_Manager_type)tempoCallback[2];
    tempoCallback[2] = 0;
    tempoCallback[3] = 0;
  }
  lVar6 = NodeId::random();
  *(long *)(this->mNodeId).super_NodeIdArray._M_elems = lVar6;
  *(long *)(this->mSessionId).super_NodeIdArray._M_elems = lVar6;
  (this->mSessionTimingGuard).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mSessionTimingGuard).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mSessionTimingGuard).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mSessionTimingGuard).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mSessionTimingGuard).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  clock_gettime(1,(timespec *)&local_88);
  (this->mGhostXForm).slope = 1.0;
  (this->mGhostXForm).intercept.__r =
       -((ulong)((long)local_88.mpService._M_t.
                       super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>
                       .super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl * 1000000000 +
                (long)local_88.mpWork._M_t.
                      super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>
                      .super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl) / 1000);
  uVar9 = 0;
  uVar11 = 0x40340000;
  dVar2 = *tempo;
  if (20.0 <= dVar2) {
    uVar9 = SUB84(dVar2,0);
    uVar11 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  lVar7 = llround(0.0);
  uVar10 = 0;
  uVar12 = 0x408f3800;
  if ((double)CONCAT44(uVar11,uVar9) <= 999.0) {
    uVar10 = uVar9;
    uVar12 = uVar11;
  }
  (this->mSessionTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl = (double)CONCAT44(uVar12,uVar10);
  (this->mSessionTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl = lVar7;
  (this->mSessionTimeline).timeOrigin.__r = 0;
  (this->mClientTimelineGuard).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mClientTimelineGuard).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mClientTimelineGuard).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mClientTimelineGuard).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mClientTimelineGuard).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->mClientTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl = (double)CONCAT44(uVar12,uVar10);
  lVar7 = llround(0.0);
  (this->mClientTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl = lVar7;
  lVar7 = llround((double)-(this->mGhostXForm).intercept.__r / (this->mGhostXForm).slope);
  (this->mClientTimeline).timeOrigin.__r = lVar7;
  (this->mRtClientTimeline).timeOrigin.__r = lVar7;
  uVar9 = *(undefined4 *)
           ((long)&(this->mClientTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
                   super__Head_base<0UL,_double,_false>._M_head_impl + 4);
  lVar6 = (this->mClientTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
          super__Head_base<0UL,_long,_false>._M_head_impl;
  uVar11 = *(undefined4 *)
            ((long)&(this->mClientTimeline).beatOrigin.super_tuple<long>.
                    super__Tuple_impl<0UL,_long>.super__Head_base<0UL,_long,_false>._M_head_impl + 4
            );
  *(undefined4 *)
   &(this->mRtClientTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
    super__Head_base<0UL,_double,_false>._M_head_impl =
       *(undefined4 *)
        &(this->mClientTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
         super__Head_base<0UL,_double,_false>._M_head_impl;
  *(undefined4 *)
   ((long)&(this->mRtClientTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
           super__Head_base<0UL,_double,_false>._M_head_impl + 4) = uVar9;
  *(int *)&(this->mRtClientTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
           super__Head_base<0UL,_long,_false>._M_head_impl = (int)lVar6;
  *(undefined4 *)
   ((long)&(this->mRtClientTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
           super__Head_base<0UL,_long,_false>._M_head_impl + 4) = uVar11;
  (this->mRtClientTimelineTimestamp).__r = 0;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_108 = (_Manager_type)0x0;
  p_Stack_100 = (_Invoker_type)peerCallback[3];
  p_Var3 = (_Manager_type)peerCallback[2];
  if (p_Var3 != (_Manager_type)0x0) {
    local_118._M_unused._0_8_ = (undefined8)*peerCallback;
    local_118._8_8_ = peerCallback[1];
    peerCallback[2] = 0;
    peerCallback[3] = 0;
    local_108 = p_Var3;
  }
  (this->mSessionPeerCounter).mController = this;
  pfVar1 = &(this->mSessionPeerCounter).mCallback;
  *(undefined8 *)&(this->mSessionPeerCounter).mCallback.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->mSessionPeerCounter).mCallback.super__Function_base._M_functor + 8)
       = 0;
  (this->mSessionPeerCounter).mCallback.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mSessionPeerCounter).mCallback._M_invoker = p_Stack_100;
  if (local_108 != (_Manager_type)0x0) {
    *(void **)&(pfVar1->super__Function_base)._M_functor = local_118._M_unused._M_object;
    *(undefined8 *)
     ((long)&(this->mSessionPeerCounter).mCallback.super__Function_base._M_functor + 8) =
         local_118._8_8_;
    (this->mSessionPeerCounter).mCallback.super__Function_base._M_manager = local_108;
    local_108 = (_Manager_type)0x0;
    p_Stack_100 = (_Invoker_type)0x0;
  }
  (this->mSessionPeerCounter).mSessionPeerCount.super___atomic_base<unsigned_long>._M_i = 0;
  if (local_108 != (_Manager_type)0x0) {
    (*local_108)(&local_118,&local_118,__destroy_functor);
  }
  (this->mEnabled)._M_base._M_i = false;
  (this->mIo).val.mpService._M_t.
  super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
  super__Head_base<0UL,_asio::io_context_*,_false> =
       (_Head_base<0UL,_asio::io_context_*,_false>)param_5->_M_head_impl;
  param_5->_M_head_impl = (io_context *)0x0;
  (this->mIo).val.mpWork._M_t.
  super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>.
  super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl =
       (work *)param_5[1]._M_head_impl;
  param_5[1]._M_head_impl = (io_context *)0x0;
  (this->mIo).val.mThread._M_id._M_thread = 0;
  (this->mIo).val.mThread._M_id._M_thread = (native_handle_type)param_5[2]._M_head_impl;
  param_5[2]._M_head_impl = (io_context *)0x0;
  local_f8 = pfVar1;
  RtTimelineSetter::RtTimelineSetter(&this->mRtTimelineSetter,this);
  (this->mPeers).mpImpl.
  super___shared_ptr<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  local_f0 = &this->mPeers;
  p_Var8->_M_use_count = 1;
  p_Var8->_M_weak_count = 1;
  p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001792b8;
  p_Var8[1]._vptr__Sp_counted_base = (_func_int **)&this->mIo;
  *(SessionPeerCounter **)&p_Var8[1]._M_use_count = &this->mSessionPeerCounter;
  p_Var8[2]._vptr__Sp_counted_base = (_func_int **)this;
  p_Var8[2]._M_use_count = 0;
  p_Var8[2]._M_weak_count = 0;
  p_Var8[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var8[3]._M_use_count = 0;
  p_Var8[3]._M_weak_count = 0;
  (this->mPeers).mpImpl.
  super___shared_ptr<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var8;
  (this->mPeers).mpImpl.
  super___shared_ptr<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)(p_Var8 + 1);
  uVar4 = *(undefined8 *)(this->mSessionId).super_NodeIdArray._M_elems;
  local_c8 = (this->mSessionTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
             super__Head_base<0UL,_double,_false>._M_head_impl;
  lStack_c0 = (this->mSessionTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
              super__Head_base<0UL,_long,_false>._M_head_impl;
  rVar5 = (this->mSessionTimeline).timeOrigin.__r;
  local_b8 = (this->mGhostXForm).slope;
  rStack_b0 = (this->mGhostXForm).intercept.__r;
  clock_gettime(1,(timespec *)&local_88);
  (this->mSessions).mPeers.ref._M_data = local_f0;
  (this->mSessions).mMeasure.mController = this;
  (this->mSessions).mCallback.mController = this;
  *(undefined8 *)(this->mSessions).mCurrent.sessionId.super_NodeIdArray._M_elems = uVar4;
  (this->mSessions).mCurrent.timeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl = local_c8;
  (this->mSessions).mCurrent.timeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl = lStack_c0;
  (this->mSessions).mCurrent.timeline.timeOrigin.__r = rVar5;
  (this->mSessions).mCurrent.measurement.xform.slope = local_b8;
  (this->mSessions).mCurrent.measurement.xform.intercept.__r = rStack_b0;
  (this->mSessions).mCurrent.measurement.timestamp.__r =
       (ulong)((long)local_88.mpService._M_t.
                     super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>
                     .super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl * 1000000000 +
              (long)local_88.mpWork._M_t.
                    super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>
                    .super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl) / 1000;
  (this->mSessions).mIo.ref._M_data = &(this->mIo).val;
  platforms::asio::AsioTimer::AsioTimer
            (&(this->mSessions).mTimer,
             (io_context *)
             (this->mIo).val.mpService._M_t.
             super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
             super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
             super__Head_base<0UL,_asio::io_context_*,_false>);
  (this->mSessions).mOtherSessions.
  super__Vector_base<ableton::link::Session,_std::allocator<ableton::link::Session>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mSessions).mOtherSessions.
  super__Vector_base<ableton::link::Session,_std::allocator<ableton::link::Session>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mSessions).mOtherSessions.
  super__Vector_base<ableton::link::Session,_std::allocator<ableton::link::Session>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.first.nodeId.super_NodeIdArray._M_elems =
       *(NodeIdArray *)(this->mNodeId).super_NodeIdArray._M_elems;
  local_68.first.sessionId.super_NodeIdArray._M_elems =
       *(NodeIdArray *)(this->mSessionId).super_NodeIdArray._M_elems;
  local_68.first.timeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (tuple<double>)
       (this->mSessionTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  local_68.first.timeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl =
       (tuple<long>)
       (this->mSessionTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
       super__Head_base<0UL,_long,_false>._M_head_impl;
  local_68.first.timeline.timeOrigin.__r = (this->mSessionTimeline).timeOrigin.__r;
  local_68.second.slope = (this->mGhostXForm).slope;
  local_68.second.intercept.__r = (this->mGhostXForm).intercept.__r;
  platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>::
  Context<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::UdpSendExceptionHandler>
            ((Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog> *)&local_e8,
             (UdpSendExceptionHandler)this);
  local_a8.mThread._M_id._M_thread = local_e8.mThread._M_id._M_thread;
  local_a8.mpWork._M_t.
  super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>.
  super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl =
       local_e8.mpWork._M_t.
       super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>.
       _M_t.
       super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>
       .super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl;
  local_a8.mpService._M_t.
  super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
  super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl =
       local_e8.mpService._M_t.
       super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
       super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
       super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl;
  local_e8.mpService._M_t.
  super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
  super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl =
       (__uniq_ptr_data<asio::io_context,_std::default_delete<asio::io_context>,_true,_true>)
       (__uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>)0x0;
  local_e8.mpWork._M_t.
  super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>.
  super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl =
       (__uniq_ptr_data<asio::io_context::work,_std::default_delete<asio::io_context::work>,_true,_true>
        )(__uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>)0x0;
  local_e8.mThread._M_id._M_thread = (id)0;
  local_88.mpService._M_t.
  super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
  super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl =
       (__uniq_ptr_data<asio::io_context,_std::default_delete<asio::io_context>,_true,_true>)
       (__uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>)0x0;
  local_88.mpWork._M_t.
  super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>.
  super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl =
       (__uniq_ptr_data<asio::io_context::work,_std::default_delete<asio::io_context::work>,_true,_true>
        )(__uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>)0x0;
  local_88.mThread._M_id._M_thread = (id)0;
  platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>::
  ~Context(&local_88);
  discovery::
  Service<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  ::Service(&this->mDiscovery,&local_68,(GatewayFactory)this,
            (Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
             *)&local_a8);
  platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>::
  ~Context(&local_a8);
  platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>::
  ~Context(&local_e8);
  return;
}

Assistant:

Controller(Tempo tempo,
    PeerCountCallback peerCallback,
    TempoCallback tempoCallback,
    Clock clock,
    util::Injected<IoContext> io)
    : mTempoCallback(std::move(tempoCallback))
    , mClock(std::move(clock))
    , mNodeId(NodeId::random())
    , mSessionId(mNodeId)
    , mGhostXForm(detail::initXForm(mClock))
    , mSessionTimeline(clampTempo({tempo, Beats{0.}, std::chrono::microseconds{0}}))
    , mClientTimeline({mSessionTimeline.tempo, Beats{0.},
        mGhostXForm.ghostToHost(std::chrono::microseconds{0})})
    , mRtClientTimeline(mClientTimeline)
    , mRtClientTimelineTimestamp(0)
    , mSessionPeerCounter(*this, std::move(peerCallback))
    , mEnabled(false)
    , mIo(std::move(io))
    , mRtTimelineSetter(*this)
    , mPeers(util::injectRef(*mIo),
        std::ref(mSessionPeerCounter),
        SessionTimelineCallback{*this})
    , mSessions({mSessionId, mSessionTimeline, {mGhostXForm, mClock.micros()}},
        util::injectRef(mPeers),
        MeasurePeer{*this},
        JoinSessionCallback{*this},
        util::injectRef(*mIo),
        mClock)
    , mDiscovery(
        std::make_pair(NodeState{mNodeId, mSessionId, mSessionTimeline}, mGhostXForm),
        GatewayFactory{*this},
        util::injectVal(mIo->clone(UdpSendExceptionHandler{*this})))
  {
  }